

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::applyLifeCircle(Map *this,shared_ptr<Population> *population)

{
  Population *pPVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  TypeName TVar9;
  ParamType PVar10;
  ParamType PVar11;
  ParamType PVar12;
  ParamType PVar13;
  Config *pCVar14;
  int iVar15;
  pointer pvVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int local_6c;
  ulong local_68;
  
  iVar2 = Population::GetXPos((population->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar3 = Population::GetYPos((population->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  lVar17 = (long)iVar2 * 0x10;
  iVar4 = CellType::getPlantsCount
                    (*(CellType **)
                      (*(long *)&(this->map).
                                 super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                 super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                 ._M_impl + lVar17));
  iVar5 = CellType::getWaterLevel
                    (*(CellType **)
                      (*(long *)&(this->map).
                                 super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                 super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                 ._M_impl + lVar17));
  uVar19 = uVar3 - 1;
  if ((uVar3 & 0x80000001) == 1) {
    local_6c = CellType::getHerbivoreCount
                         (*(CellType **)
                           (*(long *)&(this->map).
                                      super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                      super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                      ._M_impl + lVar17));
    iVar6 = CellType::getCarnivoreCount
                      (*(CellType **)
                        (*(long *)&(this->map).
                                   super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                   ._M_impl + lVar17));
    uVar18 = (ulong)(uVar3 + 1);
    pvVar16 = (this->map).
              super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar18 < (ulong)(((long)(this->map).
                                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16) / 0x18))
    {
      iVar7 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&pvVar16[uVar18].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          + lVar17));
      local_6c = local_6c + iVar7;
      iVar7 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar6 = iVar6 + iVar7;
      pvVar16 = (this->map).
                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (0 < iVar2) {
      lVar17 = (ulong)(iVar2 - 1) * 0x10;
      iVar7 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&pvVar16[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          + lVar17));
      local_6c = local_6c + iVar7;
      iVar7 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar6 = iVar6 + iVar7;
      pvVar16 = (this->map).
                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    local_68 = (ulong)(iVar2 + 1);
    if (local_68 <
        (ulong)((long)*(pointer *)
                       ((long)&(pvVar16->
                               super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                               )._M_impl + 8) -
                *(long *)&(pvVar16->
                          super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          )._M_impl >> 4)) {
      lVar17 = local_68 * 0x10;
      iVar2 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&pvVar16[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          + lVar17));
      iVar7 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar8 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      local_6c = iVar8 + iVar2 + local_6c;
      iVar2 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar6 = iVar2 + iVar7 + iVar6;
      pvVar16 = (this->map).
                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar18 < (ulong)(((long)(this->map).
                                  super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16) / 0x18
                          )) {
LAB_0012bafe:
        iVar2 = CellType::getHerbivoreCount
                          (*(CellType **)
                            (*(long *)&pvVar16[uVar18].
                                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                       ._M_impl + local_68 * 0x10));
        local_6c = iVar2 + local_6c;
        iVar2 = CellType::getCarnivoreCount
                          (*(CellType **)
                            (*(long *)&(this->map).
                                       super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                       ._M_impl + local_68 * 0x10));
        iVar6 = iVar2 + iVar6;
      }
    }
  }
  else {
    if ((int)uVar3 < 1) {
      iVar6 = 0;
      local_6c = 0;
    }
    else {
      local_6c = CellType::getHerbivoreCount
                           (*(CellType **)
                             (*(long *)&(this->map).
                                        super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                        super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                        ._M_impl + lVar17));
      iVar6 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
    }
    uVar18 = (ulong)(int)(uVar3 + 1);
    pvVar16 = (this->map).
              super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar18 < (ulong)(((long)(this->map).
                                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16) / 0x18))
    {
      iVar7 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&pvVar16[uVar18].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          + lVar17));
      local_6c = local_6c + iVar7;
      iVar7 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar6 = iVar6 + iVar7;
      pvVar16 = (this->map).
                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((ulong)(long)(iVar2 + 1) <
        (ulong)((long)*(pointer *)
                       ((long)&(pvVar16->
                               super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                               )._M_impl + 8) -
                *(long *)&(pvVar16->
                          super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          )._M_impl >> 4)) {
      lVar17 = (long)(iVar2 + 1) * 0x10;
      iVar7 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&pvVar16[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                          + lVar17));
      local_6c = local_6c + iVar7;
      iVar7 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar6 = iVar6 + iVar7;
    }
    if (0 < iVar2) {
      local_68 = (ulong)(iVar2 - 1);
      lVar17 = local_68 * 0x10;
      iVar2 = CellType::getHerbivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      local_6c = iVar2 + local_6c;
      iVar2 = CellType::getCarnivoreCount
                        (*(CellType **)
                          (*(long *)&(this->map).
                                     super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                     ._M_impl + lVar17));
      iVar6 = iVar2 + iVar6;
      if (0 < (int)uVar3) {
        iVar2 = CellType::getHerbivoreCount
                          (*(CellType **)
                            (*(long *)&(this->map).
                                       super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                       ._M_impl + lVar17));
        local_6c = local_6c + iVar2;
        iVar2 = CellType::getCarnivoreCount
                          (*(CellType **)
                            (*(long *)&(this->map).
                                       super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                       ._M_impl + lVar17));
        iVar6 = iVar6 + iVar2;
      }
      pvVar16 = (this->map).
                super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar18 < (ulong)(((long)(this->map).
                                  super__Vector_base<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16) / 0x18
                          )) goto LAB_0012bafe;
    }
  }
  TVar9 = Population::GetType((population->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (TVar9 == CARNIVORE) {
    pCVar14 = Config::getInstance();
    iVar2 = Config::getMaxAmount(pCVar14,HERBIVORE,AVERAGE);
    iVar4 = ((local_6c / 3) * 100) / iVar2;
  }
  pPVar1 = (population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = Population::GetAnimalAmount(pPVar1);
  Population::SetAnimalAmount(pPVar1,(iVar2 * ((iVar4 + iVar5) / 2)) / 100);
  pCVar14 = Config::getInstance();
  iVar2 = Config::getMaxAmount(pCVar14,CARNIVORE,AVERAGE);
  uVar18 = (long)((iVar6 / 3) * 100) / (long)iVar2;
  iVar4 = (int)uVar18;
  PVar10 = Population::GetVelocity
                     ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  switch(PVar10) {
  case VERY_SMALL:
    iVar4 = (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) / 2);
    goto switchD_0012bc00_default;
  case SMALL:
    iVar4 = iVar4 * 2;
  case BIG:
    iVar15 = 5;
    break;
  case AVERAGE:
    iVar4 = iVar4 * 3;
    iVar15 = 10;
    break;
  case VERY_BIG:
    iVar15 = 10;
    break;
  default:
    goto switchD_0012bc00_default;
  }
  iVar4 = iVar4 / iVar15;
switchD_0012bc00_default:
  pPVar1 = (population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = Population::GetAnimalAmount(pPVar1);
  Population::SetAnimalAmount(pPVar1,(iVar2 * (100 - iVar4)) / 100);
  pPVar1 = (population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = Population::GetAnimalAmount(pPVar1);
  iVar5 = Population::GetProductivity
                    ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
  iVar4 = ((iVar5 + 200) * iVar2) / 100;
  pCVar14 = Config::getInstance();
  TVar9 = Population::GetType((population->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  PVar10 = Population::GetSize((population->
                               super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  iVar2 = Config::getMaxAmount(pCVar14,TVar9,PVar10);
  if (iVar2 < iVar4) {
    iVar4 = iVar2;
  }
  Population::SetAnimalAmount(pPVar1,iVar4);
  iVar2 = Population::GetProductivity
                    ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
  PVar10 = Population::GetSize((population->
                               super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  PVar11 = Population::GetCover
                     ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  iVar5 = Population::GetHealth
                    ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
  PVar12 = Population::GetVelocity
                     ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  PVar13 = Population::GetSafety
                     ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  Population::SetBiologyDev
            ((population->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (int)((PVar13 + PVar12) * iVar5 + (PVar11 + PVar10) * iVar2) / 0x14);
  return;
}

Assistant:

void Map::applyLifeCircle(std::shared_ptr<Population> population) {
  int32_t xPos = population->GetXPos();
  int32_t yPos = population->GetYPos();
  int32_t food = map[yPos][xPos]->getPlantsCount();
  int32_t water = map[yPos][xPos]->getWaterLevel();
  int32_t herbivoreAmount = 0;
  int32_t carnivoreAmount = 0;

  if (yPos % 2 == 1) {
    if (yPos - 1 >= 0) {
      herbivoreAmount += map[yPos - 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos - 1][xPos]->getCarnivoreCount();
    }
    if (yPos + 1 < getHeight()) {
      herbivoreAmount += map[yPos + 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos + 1][xPos]->getCarnivoreCount();
    }
    if (xPos - 1 >= 0) {
      herbivoreAmount += map[yPos][xPos - 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos - 1]->getCarnivoreCount();
    }
    if (xPos + 1 < getWidth()) {
      herbivoreAmount += map[yPos][xPos + 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos + 1]->getCarnivoreCount();
      if (yPos - 1 >= 0) {
        herbivoreAmount += map[yPos - 1][xPos + 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos - 1][xPos + 1]->getCarnivoreCount();
      }
      if (yPos + 1 < getHeight()) {
        herbivoreAmount += map[yPos + 1][xPos + 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos + 1][xPos + 1]->getCarnivoreCount();
      }
    }
  } else {
    if (yPos - 1 >= 0) {
      herbivoreAmount += map[yPos - 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos - 1][xPos]->getCarnivoreCount();
    }
    if (yPos + 1 < getHeight()) {
      herbivoreAmount += map[yPos + 1][xPos]->getHerbivoreCount();
      carnivoreAmount += map[yPos + 1][xPos]->getCarnivoreCount();
    }
    if (xPos + 1 < getWidth()) {
      herbivoreAmount += map[yPos][xPos + 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos + 1]->getCarnivoreCount();
    }
    if (xPos - 1 >= 0) {
      herbivoreAmount += map[yPos][xPos - 1]->getHerbivoreCount();
      carnivoreAmount += map[yPos][xPos - 1]->getCarnivoreCount();
      if (yPos - 1 >= 0) {
        herbivoreAmount += map[yPos - 1][xPos - 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos - 1][xPos - 1]->getCarnivoreCount();
      }
      if (yPos + 1 < getHeight()) {
        herbivoreAmount += map[yPos + 1][xPos - 1]->getHerbivoreCount();
        carnivoreAmount += map[yPos + 1][xPos - 1]->getCarnivoreCount();
      }
    }
  }

  herbivoreAmount /= 3;
  carnivoreAmount /= 3;
  //if there's no food or water someone must die
  int32_t nutrition = (food + water) / 2;
  if (population->GetType() == Population::TypeName::CARNIVORE) {
    nutrition =
        (herbivoreAmount * 100 / Config::getInstance().getMaxAmount(Population::HERBIVORE, Population::AVERAGE) + water)
            / 2;
  }
  population->SetAnimalAmount((population->GetAnimalAmount() * nutrition) / 100);
  // carnivore animal can eat some animals from the population
  int32_t
      wasEaten = carnivoreAmount * 100 / Config::getInstance().getMaxAmount(Population::CARNIVORE, Population::AVERAGE);
  switch (population->GetVelocity()) {
    case Population::VERY_SMALL:wasEaten = wasEaten / 2;
      break;
    case Population::SMALL:wasEaten = wasEaten * 2 / 5;
      break;
    case Population::AVERAGE:wasEaten = wasEaten * 3 / 10;
      break;
    case Population::BIG:wasEaten = wasEaten / 5;
      break;
    case Population::VERY_BIG:wasEaten = wasEaten / 10;
      break;
  }
  population->SetAnimalAmount((population->GetAnimalAmount() * (100 - wasEaten)) / 100);
  // but new animals are born
  population->SetAnimalAmount(std::min(population->GetAnimalAmount() * (population->GetProductivity() + 200) / 100,
                                       Config::getInstance().getMaxAmount(population->GetType(),
                                                                          population->GetSize())));

  //some game points
  int32_t k = (population->GetProductivity()
      * (static_cast<int32_t>(population->GetSize()) + static_cast<int32_t>(population->GetCover()))
      + population->GetHealth()
          * (static_cast<int32_t>(population->GetVelocity()) + static_cast<int32_t>(population->GetSafety()))) / 20;
  population->SetBiologyDev(k);
}